

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ArrayFeatureType::SharedDtor(ArrayFeatureType *this)

{
  bool bVar1;
  ArrayFeatureType *this_local;
  
  bVar1 = has_ShapeFlexibility(this);
  if (bVar1) {
    clear_ShapeFlexibility(this);
  }
  bVar1 = has_defaultOptionalValue(this);
  if (bVar1) {
    clear_defaultOptionalValue(this);
  }
  return;
}

Assistant:

void ArrayFeatureType::SharedDtor() {
  if (has_ShapeFlexibility()) {
    clear_ShapeFlexibility();
  }
  if (has_defaultOptionalValue()) {
    clear_defaultOptionalValue();
  }
}